

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mprintf.c
# Opt level: O3

int dprintf_formatf(void *data,_func_int_int_FILE_ptr *stream,char *format,__va_list_tag *ap_save)

{
  bool bVar1;
  bool bVar2;
  byte *__nptr;
  char cVar3;
  int iVar4;
  int iVar5;
  undefined8 *puVar6;
  undefined8 *puVar7;
  double *pdVar8;
  long lVar9;
  ulong uVar10;
  double dVar11;
  size_t sVar12;
  double dVar13;
  uint uVar14;
  double *pdVar15;
  uint *puVar16;
  long lVar17;
  char *pcVar18;
  double dVar19;
  long lVar20;
  size_t maxlength;
  int *piVar21;
  double dVar22;
  byte *pbVar23;
  byte bVar24;
  ulong uVar25;
  int iVar26;
  double dVar27;
  long lVar28;
  uint uVar29;
  ulong uVar30;
  byte bVar31;
  char formatbuf [32];
  char work [326];
  va_stack_t vto [128];
  char *endpos [128];
  undefined8 *local_15f0;
  char *local_15d8;
  undefined8 *local_15d0;
  __va_list_tag *local_15c8;
  char *local_15c0;
  ulong local_15b8;
  undefined8 *local_15b0;
  char local_15a8 [32];
  undefined8 local_1588;
  char local_1444;
  undefined1 local_1443 [11];
  undefined4 local_1438;
  undefined4 local_1434;
  undefined1 local_1430 [8];
  undefined8 local_1428;
  double local_1420 [509];
  undefined8 local_438 [129];
  
  bVar31 = *format;
  local_1588 = (byte *)format;
  if (bVar31 != 0) {
    pcVar18 = (char *)0x0;
    puVar6 = local_438;
    local_15b8 = local_15b8 & 0xffffffff00000000;
LAB_001024d3:
    pbVar23 = local_1588 + 1;
    while (bVar31 == 0x25) {
      if (*pbVar23 != 0x25) {
        iVar26 = (int)local_15b8 + 1;
        local_15c8 = ap_save;
        local_15b0 = puVar6;
        local_1588 = pbVar23;
        puVar6 = (undefined8 *)dprintf_DollarString((char *)pbVar23,(char **)&local_1588);
        local_15b8 = CONCAT44(local_15b8._4_4_,iVar26);
        local_15d0 = (undefined8 *)(long)iVar26;
        if (puVar6 != (undefined8 *)0x0) {
          local_15d0 = puVar6;
        }
        if ((long)pcVar18 < (long)local_15d0) {
          pcVar18 = (char *)local_15d0;
        }
        puVar6 = (undefined8 *)0x0;
        local_15f0 = (undefined8 *)0x0;
        uVar29 = 0;
        local_15c0 = pcVar18;
        pbVar23 = local_1588;
        goto switchD_0010257b_caseD_1;
      }
      bVar31 = pbVar23[1];
      pbVar23 = pbVar23 + 2;
      if (bVar31 == 0) goto LAB_001029df;
    }
    goto LAB_001029d5;
  }
  goto LAB_00102b79;
switchD_0010257b_caseD_1:
  local_1588 = pbVar23;
  __nptr = local_1588;
  bVar31 = *local_1588;
  uVar14 = bVar31 - 0x20;
  if (((0x2f < uVar14) || ((0x900003ff6c09U >> ((ulong)uVar14 & 0x3f) & 1) == 0)) &&
     ((0x12 < bVar31 - 0x68 || ((0x40211U >> (bVar31 - 0x68 & 0x1f) & 1) == 0)))) goto LAB_0010271e;
  pbVar23 = local_1588 + 1;
  if (bVar31 < 0x4c) {
    switch((ulong)uVar14) {
    case 0:
      uVar29 = uVar29 | 1;
      break;
    case 3:
      uVar29 = uVar29 | 8;
      break;
    case 10:
      uVar29 = uVar29 | 0x4000;
      iVar26 = (int)local_15b8 + 1;
      local_1588 = pbVar23;
      puVar7 = (undefined8 *)dprintf_DollarString((char *)pbVar23,(char **)&local_1588);
      local_15b8 = CONCAT44(local_15b8._4_4_,iVar26);
      puVar6 = (undefined8 *)(long)iVar26;
      if (puVar7 != (undefined8 *)0x0) {
        puVar6 = puVar7;
      }
      pbVar23 = local_1588;
      if ((long)local_15c0 < (long)puVar6) {
        local_15c0 = (char *)puVar6;
      }
      break;
    case 0xb:
      uVar29 = uVar29 | 2;
      break;
    case 0xd:
      uVar29 = uVar29 & 0xfffffefb | 4;
      break;
    case 0xe:
      if (*pbVar23 == 0x2a) {
        uVar29 = uVar29 | 0x10000;
        local_1588 = local_1588 + 2;
        iVar26 = (int)local_15b8 + 1;
        puVar7 = (undefined8 *)dprintf_DollarString((char *)local_1588,(char **)&local_1588);
        local_15b8 = CONCAT44(local_15b8._4_4_,iVar26);
        local_15f0 = (undefined8 *)(long)iVar26;
        if (puVar7 != (undefined8 *)0x0) {
          local_15f0 = puVar7;
        }
        pbVar23 = local_1588;
        if ((long)local_15c0 < (long)local_15f0) {
          local_15c0 = (char *)local_15f0;
        }
      }
      else {
        uVar29 = uVar29 | 0x8000;
        local_1588 = pbVar23;
        local_15f0 = (undefined8 *)strtol((char *)pbVar23,(char **)&local_1588,10);
        pbVar23 = local_1588;
      }
      break;
    case 0x10:
      uVar29 = uVar29 | (~uVar29 & 4) << 6;
    case 0x11:
    case 0x12:
    case 0x13:
    case 0x14:
    case 0x15:
    case 0x16:
    case 0x17:
    case 0x18:
    case 0x19:
      uVar29 = uVar29 | 0x2000;
      local_1588 = pbVar23;
      puVar6 = (undefined8 *)strtol((char *)__nptr,(char **)&local_1588,10);
      pbVar23 = local_1588;
    }
  }
  else if (bVar31 < 0x6c) {
    if (bVar31 == 0x4c) {
      uVar29 = uVar29 | 0x80;
    }
    else if (bVar31 == 0x4f) {
LAB_001026eb:
      uVar29 = uVar29 | 0x20;
    }
    else if (bVar31 == 0x68) {
      uVar29 = uVar29 | 0x10;
    }
  }
  else {
    if (bVar31 == 0x6c) {
      if ((uVar29 & 0x20) != 0) goto LAB_001026f4;
      goto LAB_001026eb;
    }
    if (bVar31 == 0x71) {
LAB_001026f4:
      uVar29 = uVar29 | 0x40;
    }
    else if (bVar31 == 0x7a) goto LAB_001026eb;
  }
  goto switchD_0010257b_caseD_1;
LAB_0010271e:
  if ((long)local_15d0 - 0x81U < 0xffffffffffffff80) {
    return -1;
  }
  lVar9 = (long)local_15d0 + -1;
  if (0x57 < bVar31) {
    switch(bVar31) {
    case 99:
      (&local_1438)[lVar9 * 8] = 3;
      uVar29 = uVar29 | 0x20000;
      break;
    case 100:
    case 0x69:
      (&local_1438)[lVar9 * 8] = 3;
      break;
    case 0x65:
      (&local_1438)[lVar9 * 8] = 7;
      uVar29 = uVar29 | 0x40000;
      break;
    case 0x66:
      (&local_1438)[lVar9 * 8] = 7;
      break;
    case 0x67:
      (&local_1438)[lVar9 * 8] = 7;
      uVar29 = uVar29 | 0x80000;
      break;
    case 0x6e:
      (&local_1438)[lVar9 * 8] = 4;
      break;
    case 0x6f:
      (&local_1438)[lVar9 * 8] = 3;
      uVar29 = uVar29 | 0x400;
      break;
    case 0x70:
      (&local_1438)[lVar9 * 8] = 2;
      break;
    case 0x73:
switchD_0010275f_caseD_73:
      (&local_1438)[lVar9 * 8] = 1;
      break;
    case 0x75:
      (&local_1438)[lVar9 * 8] = 3;
      uVar29 = uVar29 | 0x200;
      break;
    case 0x78:
      (&local_1438)[lVar9 * 8] = 3;
      uVar29 = uVar29 | 0xa00;
      break;
    default:
      if (bVar31 == 0x58) {
        (&local_1438)[lVar9 * 8] = 3;
        uVar29 = uVar29 | 0x1a00;
        break;
      }
    case 0x68:
    case 0x6a:
    case 0x6b:
    case 0x6c:
    case 0x6d:
    case 0x71:
    case 0x72:
    case 0x74:
    case 0x76:
    case 0x77:
switchD_0010275f_caseD_68:
      (&local_1438)[lVar9 * 8] = 0;
    }
LAB_00102936:
    (&local_1434)[lVar9 * 8] = uVar29;
    *(undefined8 **)(local_1430 + lVar9 * 0x20) = puVar6;
    local_1420[lVar9 * 4 + -1] = (double)local_15f0;
    if ((uVar29 >> 0xe & 1) != 0) {
      lVar17 = (long)puVar6 + -1;
      *(long *)(local_1430 + lVar9 * 0x20) = lVar17;
      (&local_1438)[lVar17 * 8] = 9;
      *(undefined8 *)(&local_1434 + lVar17 * 8) = 0;
      *(undefined8 *)(local_1430 + lVar17 * 0x20 + 4) = 0;
      *(undefined4 *)((long)local_1420 + lVar17 * 0x20 + -4) = 0;
    }
    if ((uVar29 >> 0x10 & 1) != 0) {
      dVar13 = (double)((long)local_15f0 + -1);
      local_1420[lVar9 * 4 + -1] = dVar13;
      (&local_1438)[(long)dVar13 * 8] = 9;
      *(undefined8 *)(&local_1434 + (long)dVar13 * 8) = 0;
      *(undefined8 *)(local_1430 + (long)dVar13 * 0x20 + 4) = 0;
      *(undefined4 *)((long)local_1420 + (long)dVar13 * 0x20 + -4) = 0;
    }
    *local_15b0 = local_1588 + 1;
    puVar6 = local_15b0 + 1;
    ap_save = local_15c8;
    pcVar18 = local_15c0;
    pbVar23 = local_1588;
LAB_001029d5:
    local_1588 = pbVar23;
    bVar31 = *local_1588;
    if (bVar31 == 0) goto LAB_001029df;
    goto LAB_001024d3;
  }
  if (bVar31 == 0x45) {
    (&local_1438)[lVar9 * 8] = 7;
    uVar29 = uVar29 | 0x41000;
    goto LAB_00102936;
  }
  if (bVar31 == 0x47) {
    (&local_1438)[lVar9 * 8] = 7;
    uVar29 = uVar29 | 0x81000;
    goto LAB_00102936;
  }
  if (bVar31 == 0x53) {
    uVar29 = uVar29 | 8;
    goto switchD_0010275f_caseD_73;
  }
  goto switchD_0010275f_caseD_68;
LAB_001029df:
  if (0 < (long)pcVar18) {
    pdVar8 = local_1420;
    do {
      uVar29 = *(uint *)((long)pdVar8 + -0x14);
      if ((uVar29 >> 0xe & 1) != 0) {
        uVar14 = ap_save->gp_offset;
        if ((ulong)uVar14 < 0x29) {
          piVar21 = (int *)((ulong)uVar14 + (long)ap_save->reg_save_area);
          ap_save->gp_offset = uVar14 + 8;
        }
        else {
          piVar21 = (int *)ap_save->overflow_arg_area;
          ap_save->overflow_arg_area = piVar21 + 2;
        }
        local_1420[(long)pdVar8[-2] * 4] = (double)(long)*piVar21;
      }
      if ((uVar29 >> 0x10 & 1) != 0) {
        uVar14 = ap_save->gp_offset;
        if ((ulong)uVar14 < 0x29) {
          piVar21 = (int *)((ulong)uVar14 + (long)ap_save->reg_save_area);
          ap_save->gp_offset = uVar14 + 8;
        }
        else {
          piVar21 = (int *)ap_save->overflow_arg_area;
          ap_save->overflow_arg_area = piVar21 + 2;
        }
        local_1420[(long)pdVar8[-1] * 4] = (double)(long)*piVar21;
      }
      switch(*(undefined4 *)(pdVar8 + -3)) {
      case 0:
      case 1:
      case 2:
      case 4:
switchD_00102a89_caseD_0:
        uVar10 = (ulong)ap_save->gp_offset;
        if (uVar10 < 0x29) {
LAB_00102a97:
          pdVar15 = (double *)(uVar10 + (long)ap_save->reg_save_area);
          ap_save->gp_offset = (int)uVar10 + 8;
        }
        else {
LAB_00102b24:
          pdVar15 = (double *)ap_save->overflow_arg_area;
          ap_save->overflow_arg_area = pdVar15 + 1;
        }
        dVar13 = *pdVar15;
        goto LAB_00102b33;
      case 3:
        if ((((~uVar29 & 0x240) == 0) || ((uVar29 & 0x40) != 0)) || ((~uVar29 & 0x220) == 0))
        goto switchD_00102a89_caseD_0;
        uVar14 = ap_save->gp_offset;
        uVar10 = (ulong)uVar14;
        if ((uVar29 & 0x20) != 0) {
          if (0x28 < uVar14) goto LAB_00102b24;
          goto LAB_00102a97;
        }
        if ((uVar29 >> 9 & 1) == 0) {
          if (uVar14 < 0x29) {
            piVar21 = (int *)(uVar10 + (long)ap_save->reg_save_area);
            ap_save->gp_offset = uVar14 + 8;
          }
          else {
            piVar21 = (int *)ap_save->overflow_arg_area;
            ap_save->overflow_arg_area = piVar21 + 2;
          }
          dVar13 = (double)(long)*piVar21;
        }
        else {
          if (uVar14 < 0x29) {
            puVar16 = (uint *)(uVar10 + (long)ap_save->reg_save_area);
            ap_save->gp_offset = uVar14 + 8;
          }
          else {
            puVar16 = (uint *)ap_save->overflow_arg_area;
            ap_save->overflow_arg_area = puVar16 + 2;
          }
          dVar13 = (double)(ulong)*puVar16;
        }
LAB_00102b33:
        *pdVar8 = dVar13;
        break;
      case 7:
        uVar29 = ap_save->fp_offset;
        if ((ulong)uVar29 < 0xa1) {
          pdVar15 = (double *)((ulong)uVar29 + (long)ap_save->reg_save_area);
          ap_save->fp_offset = uVar29 + 0x10;
        }
        else {
          pdVar15 = (double *)ap_save->overflow_arg_area;
          ap_save->overflow_arg_area = pdVar15 + 1;
        }
        *pdVar8 = *pdVar15;
        break;
      case 9:
        *(undefined4 *)(pdVar8 + -3) = 3;
      }
      pdVar8 = pdVar8 + 4;
      pcVar18 = (char *)((long)pcVar18 + -1);
    } while (pcVar18 != (char *)0x0);
  }
LAB_00102b79:
  puVar6 = local_438;
  local_15b8 = 0;
  iVar26 = 0;
  local_15c0 = "0123456789abcdefghijklmnopqrstuvwxyz";
  pcVar18 = format;
  do {
    while( true ) {
      while( true ) {
        local_15d8 = pcVar18;
        cVar3 = *format;
        if (cVar3 == '%') break;
        if (cVar3 == '\0') {
          return iVar26;
        }
        do {
          iVar4 = (*stream)((int)cVar3,(FILE *)data);
          if (iVar4 == -1) {
            return iVar26;
          }
          iVar26 = iVar26 + 1;
          cVar3 = format[1];
          format = format + 1;
          pcVar18 = format;
        } while ((cVar3 != '\0') && (pcVar18 = format, cVar3 != '%'));
      }
      local_15d8 = format + 1;
      if (format[1] != '%') break;
      format = format + 2;
      local_15d8 = format;
      iVar4 = (*stream)(0x25,(FILE *)data);
      if (iVar4 == -1) {
        return iVar26;
      }
      iVar26 = iVar26 + 1;
      pcVar18 = local_15d8;
    }
    local_15d0 = puVar6;
    lVar9 = dprintf_DollarString(local_15d8,&local_15d8);
    puVar6 = local_15d0;
    uVar10 = lVar9 + -1;
    if (lVar9 == 0) {
      uVar10 = local_15b8;
    }
    lVar9 = uVar10 * 0x20;
    uVar29 = (&local_1434)[uVar10 * 8];
    uVar30 = (ulong)uVar29;
    if ((uVar29 >> 0xe & 1) == 0) {
      local_15b8 = local_15b8 + 1;
      dVar13 = *(double *)(local_1430 + lVar9);
      dVar27 = dVar13;
    }
    else {
      dVar13 = *(double *)(local_1430 + lVar9);
      dVar27 = local_1420[(long)dVar13 * 4];
      local_15b8 = local_15b8 + 2;
      if ((long)dVar27 < 0) {
        dVar27 = (double)-(long)dVar27;
        uVar29 = uVar29 & 0xfffffefb | 4;
        uVar30 = (ulong)uVar29;
        (&local_1434)[uVar10 * 8] = uVar29;
      }
    }
    uVar29 = (uint)uVar30;
    if ((uVar29 >> 0x10 & 1) == 0) {
      dVar19 = -NAN;
      if ((short)uVar30 < 0) {
        dVar19 = local_1420[uVar10 * 4 + -1];
      }
    }
    else {
      dVar19 = local_1420[(long)local_1420[uVar10 * 4 + -1] * 4];
      local_15b8 = local_15b8 + 1;
      if ((long)dVar19 < 0) {
        dVar19 = -NAN;
      }
    }
    iVar5 = SUB84(dVar27,0);
    iVar4 = iVar26;
    switch((&local_1438)[uVar10 * 8]) {
    case 1:
      local_15c8 = (__va_list_tag *)local_1420[uVar10 * 4];
      if (local_15c8 == (__va_list_tag *)0x0) {
        if (dVar19 == -NAN || 4 < (long)dVar19) {
          uVar30 = (ulong)(uVar29 & 0xfffffff7);
          (&local_1434)[uVar10 * 8] = uVar29 & 0xfffffff7;
          dVar19 = 2.47032822920623e-323;
          local_15c8 = (__va_list_tag *)0x109114;
        }
        else {
          local_15c8 = (__va_list_tag *)0x109f7e;
          dVar19 = 0.0;
        }
      }
      else if (dVar19 == -NAN) {
        dVar19 = (double)strlen((char *)local_15c8);
      }
      dVar13 = NAN;
      if ((ulong)dVar19 < 0x7fffffffffffffff) {
        dVar13 = dVar19;
      }
      if ((uVar30 & 8) != 0) {
        iVar4 = (*stream)(0x22,(FILE *)data);
        if (iVar4 == -1) {
          return iVar26;
        }
        iVar26 = iVar26 + 1;
        uVar30 = (ulong)(uint)(&local_1434)[uVar10 * 8];
      }
      lVar9 = (long)dVar27 - (long)dVar13;
      if ((uVar30 & 4) == 0) {
        if (lVar9 < 1) {
          lVar9 = lVar9 + -1;
        }
        else {
          iVar5 = iVar5 + iVar26;
          do {
            iVar4 = (*stream)(0x20,(FILE *)data);
            if (iVar4 == -1) {
              return iVar26;
            }
            iVar26 = iVar26 + 1;
            lVar17 = lVar9 + -1;
            bVar2 = 0 < lVar9;
            lVar9 = lVar17;
          } while (lVar17 != 0 && bVar2);
          lVar9 = -1;
          iVar26 = iVar5 - SUB84(dVar13,0);
        }
      }
      if (dVar19 != 0.0) {
        dVar13 = 0.0;
        do {
          cVar3 = *(char *)((long)&local_15c8->gp_offset + (long)dVar13);
          iVar4 = SUB84(dVar13,0);
          if (cVar3 == '\0') break;
          iVar4 = (*stream)((int)cVar3,(FILE *)data);
          if (iVar4 == -1) {
            return iVar26 + SUB84(dVar13,0);
          }
          dVar13 = (double)((long)dVar13 + 1);
          iVar4 = SUB84(dVar19,0);
        } while (dVar19 != dVar13);
        iVar26 = iVar26 + iVar4;
      }
      uVar29 = (&local_1434)[uVar10 * 8];
      if (((uVar29 & 4) != 0) && (0 < lVar9)) {
        iVar4 = iVar26 + (int)lVar9;
        lVar9 = lVar9 + 1;
        do {
          iVar5 = (*stream)(0x20,(FILE *)data);
          if (iVar5 == -1) {
            return iVar26;
          }
          iVar26 = iVar26 + 1;
          lVar9 = lVar9 + -1;
        } while (1 < lVar9);
        uVar29 = (&local_1434)[uVar10 * 8];
        iVar26 = iVar4;
      }
      puVar6 = local_15d0;
      iVar4 = iVar26;
      if ((uVar29 & 8) != 0) {
        iVar4 = (*stream)(0x22,(FILE *)data);
        if (iVar4 == -1) {
          return iVar26;
        }
        iVar4 = iVar26 + 1;
      }
      break;
    case 2:
      dVar13 = local_1420[uVar10 * 4];
      if (dVar13 == 0.0) {
        if ((uVar30 & 4) == 0) {
          lVar9 = (long)dVar27 - 5;
        }
        else if ((long)dVar27 < 6) {
          lVar9 = (long)dVar27 - 6;
        }
        else {
          iVar5 = iVar26 + iVar5;
          lVar9 = (long)dVar27 - 5;
          do {
            iVar4 = (*stream)(0x20,(FILE *)data);
            if (iVar4 == -1) {
              return iVar26;
            }
            iVar26 = iVar26 + 1;
            lVar9 = lVar9 + -1;
          } while (0 < lVar9);
          lVar9 = -1;
          iVar26 = iVar5 + -5;
        }
        iVar5 = iVar26 + 5;
        cVar3 = '(';
        lVar17 = 0;
        do {
          iVar4 = (*stream)((int)cVar3,(FILE *)data);
          if (iVar4 == -1) {
            return iVar26 + (int)lVar17;
          }
          cVar3 = "(nil)"[lVar17 + 1];
          lVar17 = lVar17 + 1;
        } while (lVar17 != 5);
        iVar4 = iVar5;
        if (((*(byte *)(&local_1434 + uVar10 * 8) & 4) == 0) && (0 < lVar9)) {
          iVar4 = iVar5 + (int)lVar9;
          lVar9 = lVar9 + 1;
          do {
            iVar26 = (*stream)(0x20,(FILE *)data);
            if (iVar26 == -1) {
              return iVar5;
            }
            iVar5 = iVar5 + 1;
            lVar9 = lVar9 + -1;
          } while (1 < lVar9);
        }
      }
      else {
        local_15c0 = "0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZ";
        if ((uVar29 >> 0xc & 1) == 0) {
          local_15c0 = "0123456789abcdefghijklmnopqrstuvwxyz";
        }
        uVar25 = 1;
LAB_00102dbb:
        bVar31 = true;
        dVar22 = 7.90505033345994e-323;
        bVar2 = false;
        bVar24 = 1;
LAB_001030bb:
        if (dVar19 == -NAN) {
          dVar19 = 4.94065645841247e-324;
        }
        lVar17 = 0x144;
        if (dVar13 == 0.0) {
          pcVar18 = &local_1444;
        }
        else {
          do {
            lVar28 = lVar17;
            *(char *)((long)&local_1588 + lVar28) = local_15c0[(ulong)dVar13 % (ulong)dVar22];
            lVar17 = lVar28 + -1;
            bVar1 = (ulong)dVar22 <= (ulong)dVar13;
            dVar13 = (double)((ulong)dVar13 / (ulong)dVar22);
          } while (bVar1);
          pcVar18 = local_15a8 + lVar28 + 0x1f;
        }
        lVar28 = (long)dVar27 - (0x144 - lVar17);
        sVar12 = (long)dVar19 - (0x144 - lVar17);
        if ((bVar2 && (int)uVar25 != 0) && ((long)sVar12 < 1)) {
          lVar17 = lVar17 + -1;
          *pcVar18 = '0';
          lVar28 = lVar28 + -1;
        }
        else if (0 < (long)sVar12) {
          local_15c8 = (__va_list_tag *)CONCAT44(local_15c8._4_4_,(int)uVar25);
          local_15b0 = (undefined8 *)CONCAT71(local_15b0._1_7_,bVar31);
          memset(local_1443 + -(long)dVar19,0x30,sVar12);
          uVar25 = (ulong)local_15c8 & 0xffffffff;
          lVar28 = lVar28 - sVar12;
          lVar17 = 0x144 - (long)dVar19;
          bVar31 = (byte)local_15b0;
        }
        bVar24 = (byte)uVar25 & bVar24;
        uVar25 = CONCAT71((int7)(uVar25 >> 8),bVar24);
        lVar20 = lVar28 + -2;
        if (bVar24 == 0) {
          lVar20 = lVar28;
        }
        lVar20 = lVar20 - (ulong)(byte)(bVar31 ^ 1 | (uVar30 & 3) != 0);
        if ((uVar30 & 0x104) == 0) {
          if (lVar20 < 1) {
            lVar20 = lVar20 + -1;
          }
          else {
            local_15b0 = (undefined8 *)CONCAT71(local_15b0._1_7_,bVar31);
            local_15c8 = (__va_list_tag *)CONCAT44(local_15c8._4_4_,(int)uVar25);
            iVar4 = iVar26 + (int)lVar20;
            do {
              iVar5 = (*stream)(0x20,(FILE *)data);
              if (iVar5 == -1) {
                return iVar26;
              }
              iVar26 = iVar26 + 1;
              lVar28 = lVar20 + -1;
              bVar2 = 0 < lVar20;
              lVar20 = lVar28;
            } while (lVar28 != 0 && bVar2);
            lVar20 = -1;
            uVar25 = (ulong)local_15c8 & 0xffffffff;
            iVar26 = iVar4;
            bVar31 = (byte)local_15b0;
          }
        }
        if (bVar31 == 0) {
          iVar4 = 0x2d;
LAB_0010326e:
          iVar4 = (*stream)(iVar4,(FILE *)data);
          if (iVar4 == -1) {
            return iVar26;
          }
          iVar26 = iVar26 + 1;
        }
        else {
          if (((&local_1434)[uVar10 * 8] & 2) != 0) {
            iVar4 = 0x2b;
            goto LAB_0010326e;
          }
          if (((&local_1434)[uVar10 * 8] & 1) != 0) {
            iVar4 = 0x20;
            goto LAB_0010326e;
          }
        }
        if ((char)uVar25 != '\0') {
          iVar4 = (*stream)(0x30,(FILE *)data);
          if (iVar4 == -1) {
            return iVar26;
          }
          if ((*(byte *)((long)&local_1434 + lVar9 + 1) & 0x10) == 0) {
            iVar4 = 0x78;
          }
          else {
            iVar4 = 0x58;
          }
          iVar4 = (*stream)(iVar4,(FILE *)data);
          if (iVar4 == -1) {
            return iVar26 + 1;
          }
          iVar26 = iVar26 + 2;
        }
        if (((&local_1434)[uVar10 * 8] & 0x104) == 0x100) {
          if (lVar20 < 1) {
            lVar20 = lVar20 + -1;
          }
          else {
            iVar4 = iVar26 + (int)lVar20;
            do {
              iVar5 = (*stream)(0x30,(FILE *)data);
              if (iVar5 == -1) {
                return iVar26;
              }
              iVar26 = iVar26 + 1;
              lVar9 = lVar20 + -1;
              bVar2 = 0 < lVar20;
              lVar20 = lVar9;
            } while (lVar9 != 0 && bVar2);
            lVar20 = -1;
            iVar26 = iVar4;
          }
        }
        iVar5 = iVar26;
        if (lVar17 < 0x144) {
          iVar5 = (iVar26 - (int)lVar17) + 0x144;
          do {
            iVar4 = (*stream)((int)*(undefined1 *)((long)&local_1588 + lVar17 + 1),(FILE *)data);
            if (iVar4 == -1) {
              return iVar26;
            }
            lVar17 = lVar17 + 1;
            iVar26 = iVar26 + 1;
          } while (lVar17 != 0x144);
        }
        puVar6 = local_15d0;
        iVar4 = iVar5;
        if (((*(byte *)(&local_1434 + uVar10 * 8) & 4) != 0) && (0 < lVar20)) {
          iVar4 = iVar5 + (int)lVar20;
          lVar20 = lVar20 + 1;
          do {
            iVar26 = (*stream)(0x20,(FILE *)data);
            if (iVar26 == -1) {
              return iVar5;
            }
            iVar5 = iVar5 + 1;
            lVar20 = lVar20 + -1;
          } while (1 < lVar20);
        }
      }
      break;
    case 3:
      dVar13 = local_1420[uVar10 * 4];
      if ((uVar29 >> 0x11 & 1) == 0) {
        uVar25 = (ulong)((uint)(uVar30 >> 3) & 1);
        bVar31 = true;
        if ((uVar29 >> 10 & 1) == 0) {
          if ((uVar29 >> 0xb & 1) != 0) {
            local_15c0 = "0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZ";
            if ((uVar29 >> 0xc & 1) == 0) {
              local_15c0 = "0123456789abcdefghijklmnopqrstuvwxyz";
            }
            goto LAB_00102dbb;
          }
          dVar22 = 4.94065645841247e-323;
          if ((uVar29 >> 9 & 1) == 0) {
            dVar11 = (double)-(long)dVar13;
            if (0 < (long)dVar13) {
              dVar11 = dVar13;
            }
            bVar31 = -1 < (long)dVar13;
            bVar2 = false;
            bVar24 = 0;
            dVar13 = dVar11;
          }
          else {
            bVar2 = false;
            bVar24 = 0;
          }
        }
        else {
          dVar22 = 3.95252516672997e-323;
          bVar24 = 0;
          bVar2 = true;
        }
        goto LAB_001030bb;
      }
      if ((uVar30 & 4) == 0) {
        if ((long)dVar27 < 2) {
          dVar27 = (double)((long)dVar27 - 1);
        }
        else {
          iVar5 = iVar26 + iVar5;
          do {
            iVar4 = (*stream)(0x20,(FILE *)data);
            if (iVar4 == -1) {
              return iVar26;
            }
            iVar26 = iVar26 + 1;
            dVar27 = (double)((long)dVar27 - 1);
          } while (1 < (long)dVar27);
          dVar27 = 0.0;
          iVar26 = iVar5 + -1;
        }
      }
      iVar4 = (*stream)(SUB84(dVar13,0) & 0xff,(FILE *)data);
      if (iVar4 == -1) {
        return iVar26;
      }
      iVar5 = iVar26 + 1;
      iVar4 = iVar5;
      if (((*(byte *)(&local_1434 + uVar10 * 8) & 4) != 0) && (1 < (long)dVar27)) {
        lVar9 = (long)dVar27 + 1;
        do {
          iVar4 = (*stream)(0x20,(FILE *)data);
          if (iVar4 == -1) {
            return iVar5;
          }
          iVar5 = iVar5 + 1;
          lVar9 = lVar9 + -1;
          iVar4 = iVar26 + SUB84(dVar27,0);
        } while (2 < lVar9);
      }
      break;
    case 4:
      if ((uVar30 & 0x40) != 0) {
        *(long *)local_1420[uVar10 * 4] = (long)iVar26;
        goto switchD_00102ce7_caseD_5;
      }
      if ((uVar30 & 0x20) == 0) {
        if ((uVar30 & 0x10) == 0) {
          *(int *)local_1420[uVar10 * 4] = iVar26;
        }
        else {
          *(short *)local_1420[uVar10 * 4] = (short)iVar26;
        }
      }
      else {
        *(long *)local_1420[uVar10 * 4] = (long)iVar26;
      }
      break;
    default:
switchD_00102ce7_caseD_5:
      break;
    case 7:
      local_15a8[0x10] = '\0';
      local_15a8[0x11] = '\0';
      local_15a8[0x12] = '\0';
      local_15a8[0x13] = '\0';
      local_15a8[0x14] = '\0';
      local_15a8[0x15] = '\0';
      local_15a8[0x16] = '\0';
      local_15a8[0x17] = '\0';
      local_15a8[0x18] = '\0';
      local_15a8[0x19] = '\0';
      local_15a8[0x1a] = '\0';
      local_15a8[0x1b] = '\0';
      local_15a8[0x1c] = '\0';
      local_15a8[0x1d] = '\0';
      local_15a8[0x1e] = '\0';
      local_15a8[0x1f] = '\0';
      local_15a8[0] = '%';
      local_15a8[1] = '\0';
      local_15a8[2] = '\0';
      local_15a8[3] = '\0';
      local_15a8[4] = '\0';
      local_15a8[5] = '\0';
      local_15a8[6] = '\0';
      local_15a8[7] = '\0';
      local_15a8[8] = '\0';
      local_15a8[9] = '\0';
      local_15a8[10] = '\0';
      local_15a8[0xb] = '\0';
      local_15a8[0xc] = '\0';
      local_15a8[0xd] = '\0';
      local_15a8[0xe] = '\0';
      local_15a8[0xf] = '\0';
      sVar12 = strlen(local_15a8);
      puVar6 = local_15d0;
      dVar27 = dVar13;
      if (((uVar29 >> 0xd & 1) == 0) && (dVar27 = -NAN, (uVar29 >> 0xe & 1) != 0)) {
        dVar27 = local_1420[(long)dVar13 * 4];
      }
      if ((short)uVar30 < 0) {
        pdVar8 = local_1420 + uVar10 * 4 + -1;
LAB_00102f13:
        dVar13 = *pdVar8;
      }
      else {
        dVar13 = -NAN;
        if ((uVar29 >> 0x10 & 1) != 0) {
          pdVar8 = local_1420 + (long)local_1420[uVar10 * 4 + -1] * 4;
          goto LAB_00102f13;
        }
      }
      pbVar23 = (byte *)(local_15a8 + 1);
      if ((uVar30 & 4) != 0) {
        local_15a8[1] = 0x2d;
        pbVar23 = (byte *)(local_15a8 + 2);
      }
      if ((uVar30 & 2) != 0) {
        *pbVar23 = 0x2b;
        pbVar23 = pbVar23 + 1;
      }
      if ((uVar30 & 1) != 0) {
        *pbVar23 = 0x20;
        pbVar23 = pbVar23 + 1;
        uVar30 = (ulong)(uint)(&local_1434)[uVar10 * 8];
      }
      if ((uVar30 & 8) != 0) {
        *pbVar23 = 0x23;
        pbVar23 = pbVar23 + 1;
      }
      maxlength = 0x20 - sVar12;
      *pbVar23 = 0;
      if (-1 < (long)dVar27) {
        if (0x144 < (ulong)dVar27) {
          dVar27 = 1.60571334898405e-321;
        }
        iVar4 = curl_msnprintf((char *)pbVar23,maxlength,"%ld",dVar27);
        pbVar23 = pbVar23 + iVar4;
        maxlength = maxlength - (long)iVar4;
      }
      if (-1 < (long)dVar13) {
        lVar9 = 0x144;
        for (dVar27 = local_1420[uVar10 * 4]; 10.0 <= dVar27; dVar27 = dVar27 / 10.0) {
          lVar9 = lVar9 + -1;
        }
        dVar27 = (double)(lVar9 + -1);
        if ((long)dVar13 <= lVar9) {
          dVar27 = dVar13;
        }
        iVar4 = curl_msnprintf((char *)pbVar23,maxlength,".%ld",dVar27);
        pbVar23 = pbVar23 + iVar4;
      }
      uVar29 = (&local_1434)[uVar10 * 8];
      if ((uVar29 & 0x20) != 0) {
        *pbVar23 = 0x6c;
        pbVar23 = pbVar23 + 1;
        uVar29 = (&local_1434)[uVar10 * 8];
      }
      if ((uVar29 >> 0x12 & 1) == 0) {
        bVar31 = 0x66;
        if ((uVar29 >> 0x13 & 1) != 0) {
          bVar31 = ((uVar29 >> 0xc & 1) == 0) << 5 | 0x47;
        }
      }
      else {
        bVar31 = ((uVar29 >> 0xc & 1) == 0) << 5 | 0x45;
      }
      *pbVar23 = bVar31;
      pbVar23[1] = 0;
      sprintf((char *)&local_1588,local_15a8,SUB84(local_1420[uVar10 * 4],0));
      pcVar18 = (char *)((long)&local_1588 + 1);
      cVar3 = (char)local_1588;
      while (iVar4 = iVar26, cVar3 != '\0') {
        iVar4 = (*stream)((int)cVar3,(FILE *)data);
        if (iVar4 == -1) {
          return iVar26;
        }
        iVar26 = iVar26 + 1;
        cVar3 = *pcVar18;
        pcVar18 = pcVar18 + 1;
      }
    }
    iVar26 = iVar4;
    format = (char *)*puVar6;
    puVar6 = puVar6 + 1;
    pcVar18 = format;
  } while( true );
}

Assistant:

static int dprintf_formatf(
  void *data, /* untouched by format(), just sent to the stream() function in
                 the second argument */
  /* function pointer called for each output character */
  int (*stream)(int, FILE *),
  const char *format,    /* %-formatted string */
  va_list ap_save) /* list of parameters */
{
  /* Base-36 digits for numbers.  */
  const char *digits = lower_digits;

  /* Pointer into the format string.  */
  char *f;

  /* Number of characters written.  */
  int done = 0;

  long param; /* current parameter to read */
  long param_num = 0; /* parameter counter */

  va_stack_t vto[MAX_PARAMETERS];
  char *endpos[MAX_PARAMETERS];
  char **end;

  char work[BUFFSIZE];

  va_stack_t *p;

  /* 'workend' points to the final buffer byte position, but with an extra
     byte as margin to avoid the (false?) warning Coverity gives us
     otherwise */
  char *workend = &work[sizeof(work) - 2];

  /* Do the actual %-code parsing */
  if(dprintf_Pass1(format, vto, endpos, ap_save))
    return -1;

  end = &endpos[0]; /* the initial end-position from the list dprintf_Pass1()
                       created for us */

  f = (char *)format;
  while(*f != '\0') {
    /* Format spec modifiers.  */
    int is_alt;

    /* Width of a field.  */
    long width;

    /* Precision of a field.  */
    long prec;

    /* Decimal integer is negative.  */
    int is_neg;

    /* Base of a number to be written.  */
    unsigned long base;

    /* Integral values to be written.  */
    mp_uintmax_t num;

    /* Used to convert negative in positive.  */
    mp_intmax_t signed_num;

    char *w;

    if(*f != '%') {
      /* This isn't a format spec, so write everything out until the next one
         OR end of string is reached.  */
      do {
        OUTCHAR(*f);
      } while(*++f && ('%' != *f));
      continue;
    }

    ++f;

    /* Check for "%%".  Note that although the ANSI standard lists
       '%' as a conversion specifier, it says "The complete format
       specification shall be `%%'," so we can avoid all the width
       and precision processing.  */
    if(*f == '%') {
      ++f;
      OUTCHAR('%');
      continue;
    }

    /* If this is a positional parameter, the position must follow immediately
       after the %, thus create a %<num>$ sequence */
    param = dprintf_DollarString(f, &f);

    if(!param)
      param = param_num;
    else
      --param;

    param_num++; /* increase this always to allow "%2$s %1$s %s" and then the
                    third %s will pick the 3rd argument */

    p = &vto[param];

    /* pick up the specified width */
    if(p->flags & FLAGS_WIDTHPARAM) {
      width = (long)vto[p->width].data.num.as_signed;
      param_num++; /* since the width is extracted from a parameter, we
                      must skip that to get to the next one properly */
      if(width < 0) {
        /* "A negative field width is taken as a '-' flag followed by a
           positive field width." */
        width = -width;
        p->flags |= FLAGS_LEFT;
        p->flags &= ~FLAGS_PAD_NIL;
      }
    }
    else
      width = p->width;

    /* pick up the specified precision */
    if(p->flags & FLAGS_PRECPARAM) {
      prec = (long)vto[p->precision].data.num.as_signed;
      param_num++; /* since the precision is extracted from a parameter, we
                      must skip that to get to the next one properly */
      if(prec < 0)
        /* "A negative precision is taken as if the precision were
           omitted." */
        prec = -1;
    }
    else if(p->flags & FLAGS_PREC)
      prec = p->precision;
    else
      prec = -1;

    is_alt = (p->flags & FLAGS_ALT) ? 1 : 0;

    switch(p->type) {
    case FORMAT_INT:
      num = p->data.num.as_unsigned;
      if(p->flags & FLAGS_CHAR) {
        /* Character.  */
        if(!(p->flags & FLAGS_LEFT))
          while(--width > 0)
            OUTCHAR(' ');
        OUTCHAR((char) num);
        if(p->flags & FLAGS_LEFT)
          while(--width > 0)
            OUTCHAR(' ');
        break;
      }
      if(p->flags & FLAGS_OCTAL) {
        /* Octal unsigned integer.  */
        base = 8;
        goto unsigned_number;
      }
      else if(p->flags & FLAGS_HEX) {
        /* Hexadecimal unsigned integer.  */

        digits = (p->flags & FLAGS_UPPER)? upper_digits : lower_digits;
        base = 16;
        goto unsigned_number;
      }
      else if(p->flags & FLAGS_UNSIGNED) {
        /* Decimal unsigned integer.  */
        base = 10;
        goto unsigned_number;
      }

      /* Decimal integer.  */
      base = 10;

      is_neg = (p->data.num.as_signed < (mp_intmax_t)0) ? 1 : 0;
      if(is_neg) {
        /* signed_num might fail to hold absolute negative minimum by 1 */
        signed_num = p->data.num.as_signed + (mp_intmax_t)1;
        signed_num = -signed_num;
        num = (mp_uintmax_t)signed_num;
        num += (mp_uintmax_t)1;
      }

      goto number;

      unsigned_number:
      /* Unsigned number of base BASE.  */
      is_neg = 0;

      number:
      /* Number of base BASE.  */

      /* Supply a default precision if none was given.  */
      if(prec == -1)
        prec = 1;

      /* Put the number in WORK.  */
      w = workend;
      while(num > 0) {
        *w-- = digits[num % base];
        num /= base;
      }
      width -= (long)(workend - w);
      prec -= (long)(workend - w);

      if(is_alt && base == 8 && prec <= 0) {
        *w-- = '0';
        --width;
      }

      if(prec > 0) {
        width -= prec;
        while(prec-- > 0)
          *w-- = '0';
      }

      if(is_alt && base == 16)
        width -= 2;

      if(is_neg || (p->flags & FLAGS_SHOWSIGN) || (p->flags & FLAGS_SPACE))
        --width;

      if(!(p->flags & FLAGS_LEFT) && !(p->flags & FLAGS_PAD_NIL))
        while(width-- > 0)
          OUTCHAR(' ');

      if(is_neg)
        OUTCHAR('-');
      else if(p->flags & FLAGS_SHOWSIGN)
        OUTCHAR('+');
      else if(p->flags & FLAGS_SPACE)
        OUTCHAR(' ');

      if(is_alt && base == 16) {
        OUTCHAR('0');
        if(p->flags & FLAGS_UPPER)
          OUTCHAR('X');
        else
          OUTCHAR('x');
      }

      if(!(p->flags & FLAGS_LEFT) && (p->flags & FLAGS_PAD_NIL))
        while(width-- > 0)
          OUTCHAR('0');

      /* Write the number.  */
      while(++w <= workend) {
        OUTCHAR(*w);
      }

      if(p->flags & FLAGS_LEFT)
        while(width-- > 0)
          OUTCHAR(' ');
      break;

    case FORMAT_STRING:
            /* String.  */
      {
        static const char null[] = "(nil)";
        const char *str;
        size_t len;

        str = (char *) p->data.str;
        if(str == NULL) {
          /* Write null[] if there's space.  */
          if(prec == -1 || prec >= (long) sizeof(null) - 1) {
            str = null;
            len = sizeof(null) - 1;
            /* Disable quotes around (nil) */
            p->flags &= (~FLAGS_ALT);
          }
          else {
            str = "";
            len = 0;
          }
        }
        else if(prec != -1)
          len = (size_t)prec;
        else
          len = strlen(str);

        width -= (len > LONG_MAX) ? LONG_MAX : (long)len;

        if(p->flags & FLAGS_ALT)
          OUTCHAR('"');

        if(!(p->flags&FLAGS_LEFT))
          while(width-- > 0)
            OUTCHAR(' ');

        for(; len && *str; len--)
          OUTCHAR(*str++);
        if(p->flags&FLAGS_LEFT)
          while(width-- > 0)
            OUTCHAR(' ');

        if(p->flags & FLAGS_ALT)
          OUTCHAR('"');
      }
      break;

    case FORMAT_PTR:
      /* Generic pointer.  */
      {
        void *ptr;
        ptr = (void *) p->data.ptr;
        if(ptr != NULL) {
          /* If the pointer is not NULL, write it as a %#x spec.  */
          base = 16;
          digits = (p->flags & FLAGS_UPPER)? upper_digits : lower_digits;
          is_alt = 1;
          num = (size_t) ptr;
          is_neg = 0;
          goto number;
        }
        else {
          /* Write "(nil)" for a nil pointer.  */
          static const char strnil[] = "(nil)";
          const char *point;

          width -= (long)(sizeof(strnil) - 1);
          if(p->flags & FLAGS_LEFT)
            while(width-- > 0)
              OUTCHAR(' ');
          for(point = strnil; *point != '\0'; ++point)
            OUTCHAR(*point);
          if(! (p->flags & FLAGS_LEFT))
            while(width-- > 0)
              OUTCHAR(' ');
        }
      }
      break;

    case FORMAT_DOUBLE:
      {
        char formatbuf[32]="%";
        char *fptr = &formatbuf[1];
        size_t left = sizeof(formatbuf)-strlen(formatbuf);
        int len;

        width = -1;
        if(p->flags & FLAGS_WIDTH)
          width = p->width;
        else if(p->flags & FLAGS_WIDTHPARAM)
          width = (long)vto[p->width].data.num.as_signed;

        prec = -1;
        if(p->flags & FLAGS_PREC)
          prec = p->precision;
        else if(p->flags & FLAGS_PRECPARAM)
          prec = (long)vto[p->precision].data.num.as_signed;

        if(p->flags & FLAGS_LEFT)
          *fptr++ = '-';
        if(p->flags & FLAGS_SHOWSIGN)
          *fptr++ = '+';
        if(p->flags & FLAGS_SPACE)
          *fptr++ = ' ';
        if(p->flags & FLAGS_ALT)
          *fptr++ = '#';

        *fptr = 0;

        if(width >= 0) {
          if(width >= (long)sizeof(work))
            width = sizeof(work)-1;
          /* RECURSIVE USAGE */
          len = curl_msnprintf(fptr, left, "%ld", width);
          fptr += len;
          left -= len;
        }
        if(prec >= 0) {
          /* for each digit in the integer part, we can have one less
             precision */
          size_t maxprec = sizeof(work) - 2;
          double val = p->data.dnum;
          while(val >= 10.0) {
            val /= 10;
            maxprec--;
          }

          if(prec > (long)maxprec)
            prec = (long)maxprec-1;
          /* RECURSIVE USAGE */
          len = curl_msnprintf(fptr, left, ".%ld", prec);
          fptr += len;
        }
        if(p->flags & FLAGS_LONG)
          *fptr++ = 'l';

        if(p->flags & FLAGS_FLOATE)
          *fptr++ = (char)((p->flags & FLAGS_UPPER) ? 'E':'e');
        else if(p->flags & FLAGS_FLOATG)
          *fptr++ = (char)((p->flags & FLAGS_UPPER) ? 'G' : 'g');
        else
          *fptr++ = 'f';

        *fptr = 0; /* and a final zero termination */

        /* NOTE NOTE NOTE!! Not all sprintf implementations return number of
           output characters */
        (sprintf)(work, formatbuf, p->data.dnum);
        DEBUGASSERT(strlen(work) <= sizeof(work));
        for(fptr = work; *fptr; fptr++)
          OUTCHAR(*fptr);
      }
      break;

    case FORMAT_INTPTR:
      /* Answer the count of characters written.  */
#ifdef HAVE_LONG_LONG_TYPE
      if(p->flags & FLAGS_LONGLONG)
        *(LONG_LONG_TYPE *) p->data.ptr = (LONG_LONG_TYPE)done;
      else
#endif
        if(p->flags & FLAGS_LONG)
          *(long *) p->data.ptr = (long)done;
      else if(!(p->flags & FLAGS_SHORT))
        *(int *) p->data.ptr = (int)done;
      else
        *(short *) p->data.ptr = (short)done;
      break;

    default:
      break;
    }
    f = *end++; /* goto end of %-code */

  }
  return done;
}